

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int need_nhdr_swap(short dim0,int hdrsize)

{
  uint local_1c;
  short local_16;
  int hsize;
  short d0;
  int hdrsize_local;
  short dim0_local;
  
  local_1c = hdrsize;
  local_16 = dim0;
  hsize = hdrsize;
  d0 = dim0;
  if (dim0 == 0) {
    if (hdrsize == 0x15c) {
      hdrsize_local = 0;
    }
    else {
      nifti_swap_4bytes(1,&local_1c);
      if (local_1c == 0x15c) {
        hdrsize_local = 1;
      }
      else {
        if (1 < g_opts.debug) {
          fprintf(_stderr,"** NIFTI: bad swapped hsize = %d, unswapped = ",(ulong)local_1c);
          nifti_swap_4bytes(1,&local_1c);
          fprintf(_stderr,"%d\n",(ulong)local_1c);
        }
        hdrsize_local = -2;
      }
    }
  }
  else if ((dim0 < 1) || (7 < dim0)) {
    nifti_swap_2bytes(1,&local_16);
    if ((local_16 < 1) || (7 < local_16)) {
      if (1 < g_opts.debug) {
        fprintf(_stderr,"** NIFTI: bad swapped d0 = %d, unswapped = ",(ulong)(uint)(int)local_16);
        nifti_swap_2bytes(1,&local_16);
        fprintf(_stderr,"%d\n",(ulong)(uint)(int)local_16);
      }
      hdrsize_local = -1;
    }
    else {
      hdrsize_local = 1;
    }
  }
  else {
    hdrsize_local = 0;
  }
  return hdrsize_local;
}

Assistant:

static int need_nhdr_swap( short dim0, int hdrsize )
{
   short d0    = dim0;     /* so we won't have to swap them on the stack */
   int   hsize = hdrsize;

   if( d0 != 0 ){     /* then use it for the check */
      if( d0 > 0 && d0 <= 7 ) return 0;

      nifti_swap_2bytes(1, &d0);        /* swap? */
      if( d0 > 0 && d0 <= 7 ) return 1;

      if( g_opts.debug > 1 ){
         fprintf(stderr,"** NIFTI: bad swapped d0 = %d, unswapped = ", d0);
         nifti_swap_2bytes(1, &d0);        /* swap? */
         fprintf(stderr,"%d\n", d0);
      }

      return -1;        /* bad, naughty d0 */
   }

   /* dim[0] == 0 should not happen, but could, so try hdrsize */
   if( hsize == sizeof(nifti_1_header) ) return 0;

   nifti_swap_4bytes(1, &hsize);     /* swap? */
   if( hsize == sizeof(nifti_1_header) ) return 1;

   if( g_opts.debug > 1 ){
      fprintf(stderr,"** NIFTI: bad swapped hsize = %d, unswapped = ", hsize);
      nifti_swap_4bytes(1, &hsize);        /* swap? */
      fprintf(stderr,"%d\n", hsize);
   }

   return -2;     /* bad, naughty hsize */
}